

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

Fad<double> *
TPZMatrix<Fad<double>_>::ReturnNearestValue
          (Fad<double> *__return_storage_ptr__,Fad<double> *val,TPZVec<Fad<double>_> *Vec,
          Fad<double> *tol)

{
  long lVar1;
  Fad<double> *pFVar2;
  long lVar3;
  Fad<double> diff1;
  Fad<double> diff0;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_80;
  Fad<double> exps;
  undefined1 local_50 [32];
  
  Fad<double>::Fad(&diff0,Vec->fStore);
  diff1.val_ = (double)val;
  diff1.dx_._0_8_ = &diff0;
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
            (&exps,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&diff1);
  Fad<double>::~Fad(&diff0);
  if (ABS(tol->val_) <= ABS(exps.val_)) {
    Fad<double>::Fad(&diff1,Vec->fStore);
    local_50._0_8_ = val;
    local_50._8_8_ = &diff1;
    Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
              (&diff0,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)local_50);
    Fad<double>::~Fad(&diff1);
  }
  else {
    diff0.val_ = 10000000000.0;
    diff0.dx_.num_elts = 0;
    diff0.dx_.ptr_to_data = (double *)0x0;
    diff0.defaultVal = 0.0;
  }
  Fad<double>::Fad(&diff1);
  Fad<double>::Fad(__return_storage_ptr__,Vec->fStore);
  lVar3 = 0x20;
  for (lVar1 = 1; lVar1 < Vec->fNElements; lVar1 = lVar1 + 1) {
    Fad<double>::Fad((Fad<double> *)local_50,(Fad<double> *)((long)&Vec->fStore->val_ + lVar3));
    local_80.fadexpr_.left_ = val;
    local_80.fadexpr_.right_ = (Fad<double> *)local_50;
    Fad<double>::operator=(&diff1,&local_80);
    Fad<double>::~Fad((Fad<double> *)local_50);
    pFVar2 = &diff0;
    if ((ABS(tol->val_) <= ABS(diff1.val_)) && (ABS(diff1.val_) < ABS(diff0.val_))) {
      Fad<double>::operator=
                (__return_storage_ptr__,(Fad<double> *)((long)&Vec->fStore->val_ + lVar3));
      pFVar2 = &diff1;
    }
    Fad<double>::operator=(&diff0,pFVar2);
    lVar3 = lVar3 + 0x20;
  }
  Fad<double>::~Fad(&diff1);
  Fad<double>::~Fad(&diff0);
  Fad<double>::~Fad(&exps);
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}